

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSplitLimit
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  double dVar1;
  pointer pVVar2;
  HeapEntity *pHVar3;
  HeapEntity *pHVar4;
  long lVar5;
  size_type __n;
  ulong uVar6;
  Interpreter *pIVar7;
  HeapThunk *pHVar8;
  _Rb_tree_header *p_Var9;
  allocator_type *in_RCX;
  HeapEntity *pHVar10;
  size_type sVar11;
  HeapEntity *pHVar12;
  _Link_type p_Var13;
  HeapEntity *params;
  uint uVar14;
  bool bVar15;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar16;
  HeapThunk *th;
  uint local_9c;
  undefined1 local_98 [32];
  Interpreter *local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *local_70;
  HeapEntity *local_68;
  value_type local_60;
  undefined4 local_58;
  HeapEntity *local_50;
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  local_98._0_8_ = local_98 + 0x10;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"splitLimit","");
  local_60 = (HeapThunk *)0x1300000013;
  local_58 = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_60;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector(&local_48,__l,in_RCX);
  params = (HeapEntity *)&local_48;
  pHVar10 = (HeapEntity *)args;
  validateBuiltinArgs(local_78,loc,(string *)local_98,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)params);
  if ((_func_int **)
      local_48.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
      ._M_impl.super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_48.
                    super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  pIVar7 = local_78;
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (pVVar2->v).h;
  pHVar4 = pVVar2[1].v.h;
  dVar1 = pVVar2[2].v.d;
  local_98._0_8_ = (_Link_type)0x0;
  local_98._8_8_ = (HeapEntity *)0x0;
  local_98._16_8_ = 0;
  VVar16 = makeArray(local_78,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                               *)local_98);
  local_50 = VVar16._0_8_;
  (pIVar7->scratch).t = ARRAY;
  (pIVar7->scratch).v.h = local_50;
  local_68 = local_50 + 1;
  local_70 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             (pHVar3 + 1);
  sVar11 = 0;
  lVar5._0_1_ = pHVar3[1].mark;
  lVar5._1_1_ = pHVar3[1].type;
  lVar5._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
  if (lVar5 != 0) {
    sVar11 = 0;
    local_9c = 0;
    uVar14 = 0;
    do {
      if (((long)dVar1 != 0xffffffffffffffff) &&
         (pHVar10 = local_50,
         (ulong)(long)dVar1 <=
         (ulong)(*(long *)&local_50[1].mark - (long)local_50[1]._vptr_HeapEntity >> 3))) break;
      __n._0_1_ = pHVar4[1].mark;
      __n._1_1_ = pHVar4[1].type;
      __n._2_6_ = *(undefined6 *)&pHVar4[1].field_0xa;
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_98,local_70,sVar11,__n);
      pHVar10 = *(HeapEntity **)&pHVar4[1].mark;
      pHVar12 = pHVar10;
      if ((ulong)local_98._8_8_ < pHVar10) {
        pHVar12 = (HeapEntity *)local_98._8_8_;
      }
      if (pHVar12 != (HeapEntity *)0x0) {
        params = (HeapEntity *)0x0;
        do {
          if (*(pointer)(local_98._0_8_ + params * 4) !=
              *(char32_t *)((long)pHVar4[1]._vptr_HeapEntity + (long)params * 4)) {
            bVar15 = false;
            goto LAB_00176743;
          }
          params = (HeapEntity *)
                   ((long)&(((_Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                              *)&params->_vptr_HeapEntity)->_M_impl).super__Vector_impl_data.
                           _M_start + 1);
        } while (pHVar12 != params);
      }
      bVar15 = pHVar10 == (HeapEntity *)local_98._8_8_;
LAB_00176743:
      pHVar10 = (HeapEntity *)local_98._8_8_;
      if ((_Link_type)local_98._0_8_ != (_Link_type)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ * 4 + 4);
      }
      pIVar7 = local_78;
      if (bVar15) {
        pHVar8 = (anonymous_namespace)::Interpreter::
                 makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                           ((Interpreter *)local_78,(Identifier **)local_78->idArrayElement,
                            (void **)0x0,(int *)pHVar10,&params->_vptr_HeapEntity);
        local_60 = pHVar8;
        std::
        vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
        ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                     *)local_68,&local_60);
        pHVar10 = (HeapEntity *)(ulong)(uVar14 - local_9c);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_98,local_70,(ulong)local_9c,(size_type)pHVar10);
        p_Var13 = (_Link_type)local_98._0_8_;
        VVar16 = makeString(pIVar7,(UString *)local_98._0_8_);
        (pHVar8->content).t = STRING;
        (pHVar8->content).v = VVar16._0_8_;
        (pHVar8->super_HeapEntity).field_0xa = 1;
        pHVar8->self = (HeapObject *)0x0;
        std::
        _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
        ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                    *)(pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                   p_Var13);
        p_Var9 = &(pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header;
        (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header
        ;
        (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var9->_M_header;
        (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        if ((_Link_type)local_98._0_8_ != (_Link_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ * 4 + 4);
        }
        uVar14 = uVar14 + *(int *)&pHVar4[1].mark;
        local_9c = uVar14;
      }
      else {
        uVar14 = uVar14 + 1;
      }
      sVar11 = (size_type)uVar14;
      uVar6._0_1_ = pHVar3[1].mark;
      uVar6._1_1_ = pHVar3[1].type;
      uVar6._2_6_ = *(undefined6 *)&pHVar3[1].field_0xa;
    } while (sVar11 < uVar6);
    sVar11 = (size_type)local_9c;
  }
  pIVar7 = local_78;
  pHVar8 = (anonymous_namespace)::Interpreter::
           makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                     ((Interpreter *)local_78,(Identifier **)local_78->idArrayElement,(void **)0x0,
                      (int *)pHVar10,&params->_vptr_HeapEntity);
  local_60 = pHVar8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)local_68,&local_60);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)local_98,
         local_70,sVar11,0xffffffffffffffff);
  p_Var13 = (_Link_type)local_98._0_8_;
  VVar16 = makeString(pIVar7,(UString *)local_98._0_8_);
  (pHVar8->content).t = STRING;
  (pHVar8->content).v = VVar16._0_8_;
  (pHVar8->super_HeapEntity).field_0xa = 1;
  pHVar8->self = (HeapObject *)0x0;
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::_M_erase((_Rb_tree<const_jsonnet::internal::Identifier_*,_std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>,_std::_Select1st<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
              *)(pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var13);
  p_Var9 = &(pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header;
  (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
  (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
  (pHVar8->upValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((_Link_type)local_98._0_8_ != (_Link_type)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ * 4 + 4);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinSplitLimit(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "splitLimit", args, {Value::STRING, Value::STRING, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        const auto *c = static_cast<const HeapString *>(args[1].v.h);
        long maxsplits = long(args[2].v.d);
        unsigned start = 0;
        unsigned test = 0;
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        while (test < str->value.size() && (maxsplits == -1 ||
                                            size_t(maxsplits) > elements.size())) {
            if (c->value == str->value.substr(test, c->value.size())) {
                auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
                elements.push_back(th);
                th->fill(makeString(str->value.substr(start, test - start)));
                start = test + c->value.size();
                test = start;
            } else {
                ++test;
            }
        }
        auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
        elements.push_back(th);
        th->fill(makeString(str->value.substr(start)));

        return nullptr;
    }